

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Pd<(moira::Mode)4,_2> wrapper)

{
  Syntax SVar1;
  char *pcVar2;
  An an;
  An an_00;
  
  SVar1 = this->style->syntax;
  if (SVar1 < (MUSASHI|MOIRA_MIT)) {
    if ((0x15U >> (SVar1 & 0x1f) & 1) == 0) {
      an_00.raw._2_2_ = 0;
      an_00.raw._0_2_ = (wrapper.ea)->reg;
      operator<<(this,an_00);
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '@';
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '-';
    }
    else {
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '-';
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '(';
      an.raw._2_2_ = 0;
      an.raw._0_2_ = (wrapper.ea)->reg;
      operator<<(this,an);
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = ')';
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Pd<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MUSASHI:
       case Syntax::GNU:

            *this << "-(" << An{ea.reg} << ")";
            break;

        case Syntax::GNU_MIT:
        case Syntax::MOIRA_MIT:

            *this << An{ea.reg} << "@-";
            break;
    }

    return *this;
}